

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quest.cpp
# Opt level: O0

void __thiscall Quest::Load(Quest *this)

{
  World *pWVar1;
  byte bVar2;
  mapped_type *this_00;
  runtime_error *this_01;
  Quest *this_02;
  Syntax_Error *e;
  Validation_Error *e_1;
  ifstream f;
  allocator<char> local_59;
  key_type local_58;
  undefined1 local_38 [8];
  string filename;
  char namebuf [6];
  Quest *this_local;
  
  pWVar1 = this->world;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"QuestDir",&local_59);
  this_00 = std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
            ::operator[](&(pWVar1->config).
                          super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                         ,&local_58);
  util::variant::operator_cast_to_string((string *)local_38,this_00);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  sprintf(filename.field_2._M_local_buf + 10,"%05i",(ulong)(uint)(int)this->id);
  std::__cxx11::string::operator+=((string *)local_38,filename.field_2._M_local_buf + 10);
  std::__cxx11::string::operator+=((string *)local_38,".eqf");
  std::ifstream::ifstream(&e_1,(string *)local_38,_S_in);
  bVar2 = std::ios::operator!((ios *)((long)&e_1 + e_1[-1].state_._M_string_length));
  if ((bVar2 & 1) == 0) {
    this_02 = (Quest *)operator_new(0x68);
    EOPlus::Quest::Quest(this_02,(istream *)&e_1);
    this->quest = this_02;
    validate_quest(this->quest);
    std::ifstream::~ifstream(&e_1);
    std::__cxx11::string::~string((string *)local_38);
    return;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_01,"Failed to load quest");
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Quest::Load()
{
	char namebuf[6];

	std::string filename = this->world->config["QuestDir"];
	std::sprintf(namebuf, "%05i", this->id);
	filename += namebuf;
	filename += ".eqf";

	std::ifstream f(filename);

	if (!f)
		throw std::runtime_error("Failed to load quest");

	try
	{
		this->quest = new EOPlus::Quest(f);
		validate_quest(*this->quest);
	}
	catch (EOPlus::Syntax_Error& e)
	{
		Console::Err("Could not load quest: %s", filename.c_str());
		Console::Err("Syntax Error: %s (Line %i)", e.what(), e.line());
		throw;
	}
	catch (Validation_Error& e)
	{
		Console::Err("Could not load quest: %s", filename.c_str());
		Console::Err("Validation Error: %s (State: %s)", e.what(), e.state().c_str());
		throw;
	}
	catch (...)
	{
		Console::Err("Could not load quest: %s", filename.c_str());
		throw;
	}
}